

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::RandomBernoulliDynamicLayerParams::MergePartialFromCodedStream
          (RandomBernoulliDynamicLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  float *pfVar4;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  undefined8 in_RAX;
  unsigned_long uVar8;
  ulong uVar9;
  float fVar10;
  pair<unsigned_long,_bool> pVar11;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
LAB_00139571:
  do {
    pbVar2 = input->buffer_;
    uVar6 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00139594;
      input->buffer_ = pbVar2 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00139594:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    if ((uVar9 & 0x100000000) != 0) {
      uVar7 = (uint)(uVar9 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar9 == '\x15') {
          pfVar4 = (float *)input->buffer_;
          if (*(int *)&input->buffer_end_ - (int)pfVar4 < 4) {
            bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                              (input,(uint32 *)((long)&uStack_28 + 4));
            if (!bVar5) {
              return false;
            }
            fVar10 = uStack_28._4_4_;
          }
          else {
            fVar10 = *pfVar4;
            input->buffer_ = (uint8 *)(pfVar4 + 1);
          }
          this->prob_ = fVar10;
          goto LAB_00139571;
        }
      }
      else if ((uVar7 == 1) && ((char)uVar9 == '\b')) {
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) &&
           (uVar8 = (unsigned_long)(char)*puVar3, -1 < (long)uVar8)) {
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          uVar8 = pVar11.first;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            return false;
          }
        }
        this->seed_ = uVar8;
        goto LAB_00139571;
      }
    }
    if (uVar6 == 0) {
      return true;
    }
    if ((uVar6 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    if (!bVar5) {
      return false;
    }
  } while( true );
}

Assistant:

bool RandomBernoulliDynamicLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // int64 seed = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &seed_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float prob = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &prob_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.RandomBernoulliDynamicLayerParams)
  return false;
#undef DO_
}